

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall libtorrent::aux::torrent::do_connect_boost(torrent *this)

{
  int *piVar1;
  byte bVar2;
  peer_list *this_00;
  session_interface *psVar3;
  _Alloc_hider _Var4;
  pointer pptVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  uint32_t uVar9;
  undefined4 extraout_var;
  torrent_peer *this_01;
  undefined4 extraout_var_00;
  endpoint *ep;
  address *addr;
  uint uVar10;
  uint uVar11;
  pointer pptVar12;
  long value;
  torrent_state st;
  mutex_type *local_218;
  long *local_210;
  string local_208;
  pointer local_1e8;
  string local_1e0;
  undefined1 local_1c0 [8];
  uint local_1b8;
  int iStack_1b4;
  pointer local_128;
  pointer local_120;
  pointer local_118;
  address local_110;
  aux local_ec [28];
  address local_d0;
  external_ip local_b0;
  
  bVar2 = this->m_connect_boost_counter;
  if (bVar2 != 0) {
    iVar7 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [0x2e])();
    local_1c0 = (undefined1  [8])(CONCAT44(extraout_var,iVar7) + 0x438);
    local_1b8 = local_1b8 & 0xffffff00;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_1c0);
    local_1b8 = CONCAT31(local_1b8._1_3_,true);
    iVar7 = *(int *)(CONCAT44(extraout_var,iVar7) + 0x2fc);
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_1c0);
    iVar8 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [0x1e])();
    uVar10 = iVar7 - iVar8;
    if (uVar10 != 0) {
      uVar11 = (uint)bVar2;
      if ((int)uVar10 < (int)(uint)bVar2) {
        uVar11 = uVar10;
      }
      if ((this->super_torrent_hot_members).m_peer_list._M_t.
          super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
          ._M_t.
          super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
          .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl !=
          (peer_list *)0x0) {
        bVar6 = want_peers(this);
        if ((bVar6) && (0 < (int)uVar10)) {
          do {
            this->m_connect_boost_counter = this->m_connect_boost_counter + 0xff;
            get_peer_list_state((torrent_state *)local_1c0,this);
            this_00 = (this->super_torrent_hot_members).m_peer_list._M_t.
                      super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
                      .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl;
            uVar10 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                       _vptr_session_logger[0xf])();
            this_01 = peer_list::connect_one_peer
                                (this_00,uVar10 & 0xffff,(torrent_state *)local_1c0);
            pptVar5 = local_120;
            pptVar12 = local_128;
            if ((this->super_torrent_hot_members).m_picker._M_t.
                super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                ._M_t.
                super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl !=
                (piece_picker *)0x0) {
              for (; pptVar12 != pptVar5; pptVar12 = pptVar12 + 1) {
                piece_picker::clear_peer
                          ((this->super_torrent_hot_members).m_picker._M_t.
                           super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                           .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                           _M_head_impl,*pptVar12);
              }
            }
            value = (long)iStack_1b4;
            iVar7 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                      _vptr_session_logger[0x4b])();
            counters::inc_stats_counter((counters *)CONCAT44(extraout_var_00,iVar7),0x34,value);
            if (this_01 != (torrent_peer *)0x0) {
              iVar7 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
              if ((char)iVar7 != '\0') {
                (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[3])(&local_b0);
                torrent_peer::address(this_01);
                boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
                          ((basic_endpoint<boost::asio::ip::tcp> *)local_ec,(address *)&local_208,
                           this_01->port);
                print_endpoint_abi_cxx11_(&local_1e0,local_ec,ep);
                local_1e8 = local_1e0._M_dataplus._M_p;
                uVar10 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                           _vptr_session_logger[0x20])();
                uVar9 = torrent_peer::rank(this_01,&local_b0,uVar10 & 0xffff);
                torrent_peer::address(this_01);
                external_ip::external_address(&local_110,&local_b0,&local_d0);
                print_address_abi_cxx11_(&local_208,(aux *)&local_110,addr);
                _Var4._M_p = local_208._M_dataplus._M_p;
                uVar10 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                           _vptr_session_logger[0xf])();
                (*(this->super_request_callback)._vptr_request_callback[7])
                          (this,
                           " *** FOUND CONNECTION CANDIDATE [ ip: %s rank: %u external: %s t: %d ]",
                           local_1e8,(ulong)uVar9,_Var4._M_p,
                           (ulong)((uVar10 & 0xffff) - (uint)this_01->last_connected));
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_208._M_dataplus._M_p != &local_208.field_2) {
                  operator_delete(local_208._M_dataplus._M_p,
                                  local_208.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                  operator_delete(local_1e0._M_dataplus._M_p,
                                  local_1e0.field_2._M_allocated_capacity + 1);
                }
              }
              bVar6 = connect_to_peer(this,this_01,false);
              if (bVar6) {
                (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[0x40])();
              }
              else {
                peer_list::inc_failcount
                          ((this->super_torrent_hot_members).m_peer_list._M_t.
                           super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
                           .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl,
                           this_01);
              }
            }
            update_want_peers(this);
            if (local_128 != (pointer)0x0) {
              operator_delete(local_128,(long)local_118 - (long)local_128);
            }
            bVar6 = want_peers(this);
          } while ((bVar6) && (bVar6 = 1 < (int)uVar11, uVar11 = uVar11 - 1, bVar6));
        }
        bVar6 = want_peers(this);
        if (bVar6) {
          psVar3 = (this->super_torrent_hot_members).m_ses;
          ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<libtorrent::aux::torrent,void>
                    ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)local_1c0,
                     (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
                     &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
          local_210 = (long *)CONCAT44(iStack_1b4,local_1b8);
          local_218 = (mutex_type *)local_1c0;
          if (local_210 != (long *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)((long)local_210 + 0xc) = *(int *)((long)local_210 + 0xc) + 1;
              UNLOCK();
            }
            else {
              *(int *)((long)local_210 + 0xc) = *(int *)((long)local_210 + 0xc) + 1;
            }
          }
          (*(psVar3->super_session_logger)._vptr_session_logger[0x2b])(psVar3,&local_218);
          if (local_210 != (long *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              piVar1 = (int *)((long)local_210 + 0xc);
              iVar7 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
            }
            else {
              iVar7 = *(int *)((long)local_210 + 0xc);
              *(int *)((long)local_210 + 0xc) = iVar7 + -1;
            }
            if (iVar7 == 1) {
              (**(code **)(*local_210 + 0x18))();
            }
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(iStack_1b4,local_1b8) !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       CONCAT44(iStack_1b4,local_1b8));
          }
        }
      }
    }
  }
  return;
}

Assistant:

void torrent::do_connect_boost()
	{
		if (m_connect_boost_counter == 0) return;

		// this is the first tracker response for this torrent
		// instead of waiting one second for session_impl::on_tick()
		// to be called, connect to a few peers immediately
		int conns = std::min(int(m_connect_boost_counter)
			, settings().get_int(settings_pack::connections_limit) - m_ses.num_connections());

		if (conns == 0) return;

		// if we don't know of any peers
		if (!m_peer_list) return;

		while (want_peers() && conns > 0)
		{
			TORRENT_ASSERT(m_connect_boost_counter > 0);
			--conns;
			--m_connect_boost_counter;
			torrent_state st = get_peer_list_state();
			torrent_peer* p = m_peer_list->connect_one_peer(m_ses.session_time(), &st);
			peers_erased(st.erased);
			inc_stats_counter(counters::connection_attempt_loops, st.loop_counter);
			if (p == nullptr)
			{
				update_want_peers();
				continue;
			}

#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				external_ip const& external = m_ses.external_address();
				debug_log(" *** FOUND CONNECTION CANDIDATE ["
					" ip: %s rank: %u external: %s t: %d ]"
					, print_endpoint(p->ip()).c_str()
					, p->rank(external, m_ses.listen_port())
					, print_address(external.external_address(p->address())).c_str()
					, int(m_ses.session_time() - p->last_connected));
			}
#endif

			if (!connect_to_peer(p))
			{
				m_peer_list->inc_failcount(p);
				update_want_peers();
			}
			else
			{
				// increase m_ses.m_boost_connections for each connection
				// attempt. This will be deducted from the connect speed
				// the next time session_impl::on_tick() is triggered
				m_ses.inc_boost_connections();
				update_want_peers();
			}
		}

		if (want_peers()) m_ses.prioritize_connections(shared_from_this());
	}